

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_object_class_test.cpp
# Opt level: O2

value hello_world_object_impl_interface_method_invoke
                (object obj,object_impl impl,method m,void **args,size_t size)

{
  value pvVar1;
  
  pvVar1 = (value)value_create_string("Hello World",0xb);
  return pvVar1;
}

Assistant:

value hello_world_object_impl_interface_method_invoke(object obj, object_impl impl, method m, object_args args, size_t size)
{
	// TODO: Maybe we can improve this with other methods and arguments like in reflect_function_test
	static const char str[] = "Hello World";

	(void)obj;
	(void)impl;
	(void)m;
	(void)args;
	(void)size;

	return value_create_string(str, sizeof(str) - 1);
}